

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O2

void __thiscall
QTriangulator<unsigned_short>::SimpleToMonotone::monotoneDecomposition(SimpleToMonotone *this)

{
  QRBTree<int> *this_00;
  Edge *pEVar1;
  int iVar2;
  QPodPoint *pQVar3;
  bool bVar4;
  Node *pNVar5;
  Node *child;
  Edge *pEVar6;
  long lVar7;
  long lVar8;
  unsigned_short *puVar9;
  char *pcVar10;
  long lVar11;
  int iVar12;
  int i;
  long in_FS_OFFSET;
  undefined1 local_78 [12];
  undefined8 uStack_6c;
  undefined4 local_64;
  char *local_60;
  QDataBuffer<std::pair<int,_int>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_edges).siz != 0) {
    local_58.buffer = (pair<int,_int> *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.capacity = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.siz = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QDataBuffer<std::pair<int,_int>_>::QDataBuffer(&local_58,(this->m_upperVertex).siz);
    pEVar6 = (this->m_edges).buffer;
    puVar9 = &pEVar6[1].from;
    iVar12 = 0;
    for (lVar11 = 1; lVar11 < (this->m_edges).siz; lVar11 = lVar11 + 1) {
      pQVar3 = (this->m_parent->m_vertices).buffer;
      bVar4 = pQVar3[*puVar9].y < pQVar3[pEVar6[iVar12].from].y;
      if (pQVar3[*puVar9].y == pQVar3[pEVar6[iVar12].from].y) {
        bVar4 = pQVar3[*puVar9].x < pQVar3[pEVar6[iVar12].from].x;
      }
      iVar2 = (int)lVar11;
      if (!bVar4) {
        iVar2 = iVar12;
      }
      iVar12 = iVar2;
      puVar9 = puVar9 + 0x14;
    }
    pQVar3 = (this->m_parent->m_vertices).buffer;
    bVar4 = qPointIsLeftOfLine(pQVar3 + pEVar6[iVar12].from,
                               pQVar3 + pEVar6[pEVar6[iVar12].previous].from,
                               pQVar3 + pEVar6[iVar12].to);
    this->m_clockwiseOrder = bVar4;
    classifyVertices(this);
    fillPriorityQueue(this);
    this_00 = &this->m_edgeList;
LAB_003e9d17:
    do {
      lVar11 = (this->m_upperVertex).siz;
      if (lVar11 == 0) goto LAB_003ea17f;
      pEVar6 = (this->m_edges).buffer;
      iVar12 = (this->m_upperVertex).buffer[lVar11 + -1];
      (this->m_upperVertex).siz = lVar11 + -1;
      lVar11 = (long)iVar12;
      if (pEVar6[lVar11].type < (SplitVertex|EndVertex)) {
        pEVar1 = pEVar6 + lVar11;
        iVar2 = pEVar6[lVar11].previous;
        lVar8 = (long)iVar2;
        switch(pEVar6[lVar11].type) {
        case MergeVertex:
          pNVar5 = searchEdgeLeftOfPoint(this,(uint)pEVar1->from);
          if (pNVar5 == (Node *)0x0) {
            local_78._0_4_ = 2;
            local_78._4_8_ = 0;
            uStack_6c = 0;
            local_64 = 0;
            local_60 = "default";
            QMessageLogger::warning(local_78,"Inconsistent polygon. (#4)");
          }
          else {
            lVar7 = (long)pNVar5->data;
            pEVar6 = (this->m_edges).buffer;
            if (pEVar6[pEVar6[lVar7].helper].type == MergeVertex) {
              local_78._4_4_ = pEVar6[lVar7].helper;
              local_78._0_4_ = iVar12;
              QDataBuffer<std::pair<int,_int>_>::add(&local_58,(pair<int,_int> *)local_78);
              lVar7 = (long)pNVar5->data;
              pEVar6 = (this->m_edges).buffer;
            }
            pEVar6[lVar7].helper = iVar12;
          }
        case EndVertex:
          if (this->m_clockwiseOrder == true) {
            pEVar6 = (this->m_edges).buffer;
            if (pEVar6[pEVar6[lVar11].helper].type == MergeVertex) {
              local_78._4_4_ = pEVar6[lVar11].helper;
              local_78._0_4_ = iVar12;
              QDataBuffer<std::pair<int,_int>_>::add(&local_58,(pair<int,_int> *)local_78);
              pEVar6 = (this->m_edges).buffer;
            }
            lVar8 = lVar11;
            if (pEVar6[lVar11].node != (Node *)0x0) {
LAB_003e9fa6:
              QRBTree<int>::deleteNode(this_00,&pEVar6[lVar8].node);
              goto LAB_003e9d17;
            }
            pcVar10 = "Inconsistent polygon. (#5)";
          }
          else {
            pEVar6 = (this->m_edges).buffer;
            if (pEVar6[pEVar6[lVar8].helper].type == MergeVertex) {
              local_78._4_4_ = pEVar6[lVar8].helper;
              local_78._0_4_ = iVar12;
              QDataBuffer<std::pair<int,_int>_>::add(&local_58,(pair<int,_int> *)local_78);
              pEVar6 = (this->m_edges).buffer;
            }
            if (pEVar6[lVar8].node != (Node *)0x0) goto LAB_003e9fa6;
            pcVar10 = "Inconsistent polygon. (#6)";
          }
          break;
        case RegularVertex:
          if (pEVar1->pointingUp == this->m_clockwiseOrder) {
            pNVar5 = pEVar1->node;
            if (pNVar5 == (Node *)0x0) {
              pNVar5 = pEVar6[lVar8].node;
              if (pNVar5 == (Node *)0x0) {
                pcVar10 = "Inconsistent polygon. (#1)";
                break;
              }
              if (pEVar6[pEVar6[lVar8].helper].type == MergeVertex) {
                local_78._4_4_ = pEVar6[lVar8].helper;
                local_78._0_4_ = iVar12;
                QDataBuffer<std::pair<int,_int>_>::add(&local_58,(pair<int,_int> *)local_78);
                pEVar6 = (this->m_edges).buffer;
                pNVar5 = pEVar6[lVar8].node;
              }
              pEVar6[lVar11].node = pNVar5;
              pEVar6[lVar8].node = (Node *)0x0;
              (pEVar6[lVar11].node)->data = iVar12;
              pEVar6[lVar11].helper = iVar12;
            }
            else {
              if (pEVar6[pEVar1->helper].type == MergeVertex) {
                local_78._4_4_ = pEVar1->helper;
                local_78._0_4_ = iVar12;
                QDataBuffer<std::pair<int,_int>_>::add(&local_58,(pair<int,_int> *)local_78);
                pEVar6 = (this->m_edges).buffer;
                pNVar5 = pEVar6[lVar11].node;
              }
              pEVar6[lVar8].node = pNVar5;
              pEVar6[lVar11].node = (Node *)0x0;
              (pEVar6[lVar8].node)->data = iVar2;
              pEVar6[lVar8].helper = iVar12;
            }
            goto LAB_003e9d17;
          }
          pNVar5 = searchEdgeLeftOfPoint(this,(uint)pEVar1->from);
          if (pNVar5 != (Node *)0x0) {
            lVar11 = (long)pNVar5->data;
            pEVar6 = (this->m_edges).buffer;
            if (pEVar6[pEVar6[lVar11].helper].type == MergeVertex) {
              local_78._4_4_ = pEVar6[lVar11].helper;
              local_78._0_4_ = iVar12;
              QDataBuffer<std::pair<int,_int>_>::add(&local_58,(pair<int,_int> *)local_78);
              lVar11 = (long)pNVar5->data;
              pEVar6 = (this->m_edges).buffer;
            }
            pEVar6[lVar11].helper = iVar12;
            goto LAB_003e9d17;
          }
          pcVar10 = "Inconsistent polygon. (#2)";
          break;
        case StartVertex:
          goto switchD_003e9d64_caseD_3;
        case SplitVertex:
          pNVar5 = searchEdgeLeftOfPoint(this,(uint)pEVar1->from);
          if (pNVar5 == (Node *)0x0) {
            local_78._0_4_ = 2;
            local_78._4_8_ = 0;
            uStack_6c = 0;
            local_64 = 0;
            local_60 = "default";
            QMessageLogger::warning(local_78,"Inconsistent polygon. (#3)");
          }
          else {
            local_78._4_4_ = (this->m_edges).buffer[pNVar5->data].helper;
            local_78._0_4_ = iVar12;
            QDataBuffer<std::pair<int,_int>_>::add(&local_58,(pair<int,_int> *)local_78);
            (this->m_edges).buffer[pNVar5->data].helper = iVar12;
          }
switchD_003e9d64_caseD_3:
          if (this->m_clockwiseOrder == true) {
            pNVar5 = searchEdgeLeftOfEdge(this,iVar2);
            child = QRBTree<int>::newNode(this_00);
            child->data = iVar2;
            pEVar6 = (this->m_edges).buffer;
            pEVar6[lVar8].node = child;
            pEVar6[lVar8].helper = iVar12;
          }
          else {
            pNVar5 = searchEdgeLeftOfEdge(this,iVar12);
            child = QRBTree<int>::newNode(this_00);
            child->data = iVar12;
            pEVar6 = (this->m_edges).buffer;
            pEVar6[lVar11].node = child;
            pEVar6[lVar11].helper = iVar12;
          }
          QRBTree<int>::attachAfter(this_00,pNVar5,child);
          goto LAB_003e9d17;
        }
        local_60 = "default";
        local_64 = 0;
        uStack_6c = 0;
        local_78._4_8_ = 0;
        local_78._0_4_ = 2;
        QMessageLogger::warning(local_78,pcVar10);
      }
    } while( true );
  }
LAB_003ea1ae:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
LAB_003ea17f:
  for (lVar11 = 0; lVar11 < local_58.siz; lVar11 = lVar11 + 1) {
    createDiagonal(this,local_58.buffer[lVar11].first,local_58.buffer[lVar11].second);
  }
  QDataBuffer<std::pair<int,_int>_>::~QDataBuffer(&local_58);
  goto LAB_003ea1ae;
}

Assistant:

void QTriangulator<T>::SimpleToMonotone::monotoneDecomposition()
{
    if (m_edges.isEmpty())
        return;

    Q_ASSERT(!m_edgeList.root);
    QDataBuffer<std::pair<int, int> > diagonals(m_upperVertex.size());

    int i = 0;
    for (int index = 1; index < m_edges.size(); ++index) {
        if (m_parent->m_vertices.at(m_edges.at(index).from) < m_parent->m_vertices.at(m_edges.at(i).from))
            i = index;
    }
    Q_ASSERT(i < m_edges.size());
    int j = m_edges.at(i).previous;
    Q_ASSERT(j < m_edges.size());
    m_clockwiseOrder = qPointIsLeftOfLine(m_parent->m_vertices.at((quint32)m_edges.at(i).from),
        m_parent->m_vertices.at((quint32)m_edges.at(j).from), m_parent->m_vertices.at((quint32)m_edges.at(i).to));

    classifyVertices();
    fillPriorityQueue();

    // debug: set helpers explicitly (shouldn't be necessary)
    //for (int i = 0; i < m_edges.size(); ++i)
    //    m_edges.at(i).helper = m_edges.at(i).upper();

    while (!m_upperVertex.isEmpty()) {
        i = m_upperVertex.last();
        Q_ASSERT(i < m_edges.size());
        m_upperVertex.pop_back();
        j = m_edges.at(i).previous;
        Q_ASSERT(j < m_edges.size());

        QRBTree<int>::Node *leftEdgeNode = nullptr;

        switch (m_edges.at(i).type) {
        case RegularVertex:
            // If polygon interior is to the right of the vertex...
            if (m_edges.at(i).pointingUp == m_clockwiseOrder) {
                if (m_edges.at(i).node) {
                    Q_ASSERT(!m_edges.at(j).node);
                    if (m_edges.at(m_edges.at(i).helper).type == MergeVertex)
                        diagonals.add(std::pair<int, int>(i, m_edges.at(i).helper));
                    m_edges.at(j).node = m_edges.at(i).node;
                    m_edges.at(i).node = nullptr;
                    m_edges.at(j).node->data = j;
                    m_edges.at(j).helper = i;
                } else if (m_edges.at(j).node) {
                    Q_ASSERT(!m_edges.at(i).node);
                    if (m_edges.at(m_edges.at(j).helper).type == MergeVertex)
                        diagonals.add(std::pair<int, int>(i, m_edges.at(j).helper));
                    m_edges.at(i).node = m_edges.at(j).node;
                    m_edges.at(j).node = nullptr;
                    m_edges.at(i).node->data = i;
                    m_edges.at(i).helper = i;
                } else {
                    qWarning("Inconsistent polygon. (#1)");
                }
            } else {
                leftEdgeNode = searchEdgeLeftOfPoint(m_edges.at(i).from);
                if (leftEdgeNode) {
                    if (m_edges.at(m_edges.at(leftEdgeNode->data).helper).type == MergeVertex)
                        diagonals.add(std::pair<int, int>(i, m_edges.at(leftEdgeNode->data).helper));
                    m_edges.at(leftEdgeNode->data).helper = i;
                } else {
                    qWarning("Inconsistent polygon. (#2)");
                }
            }
            break;
        case SplitVertex:
            leftEdgeNode = searchEdgeLeftOfPoint(m_edges.at(i).from);
            if (leftEdgeNode) {
                diagonals.add(std::pair<int, int>(i, m_edges.at(leftEdgeNode->data).helper));
                m_edges.at(leftEdgeNode->data).helper = i;
            } else {
                qWarning("Inconsistent polygon. (#3)");
            }
            Q_FALLTHROUGH();
        case StartVertex:
            if (m_clockwiseOrder) {
                leftEdgeNode = searchEdgeLeftOfEdge(j);
                QRBTree<int>::Node *node = m_edgeList.newNode();
                node->data = j;
                m_edges.at(j).node = node;
                m_edges.at(j).helper = i;
                m_edgeList.attachAfter(leftEdgeNode, node);
                Q_ASSERT(m_edgeList.validate());
            } else  {
                leftEdgeNode = searchEdgeLeftOfEdge(i);
                QRBTree<int>::Node *node = m_edgeList.newNode();
                node->data = i;
                m_edges.at(i).node = node;
                m_edges.at(i).helper = i;
                m_edgeList.attachAfter(leftEdgeNode, node);
                Q_ASSERT(m_edgeList.validate());
            }
            break;
        case MergeVertex:
            leftEdgeNode = searchEdgeLeftOfPoint(m_edges.at(i).from);
            if (leftEdgeNode) {
                if (m_edges.at(m_edges.at(leftEdgeNode->data).helper).type == MergeVertex)
                    diagonals.add(std::pair<int, int>(i, m_edges.at(leftEdgeNode->data).helper));
                m_edges.at(leftEdgeNode->data).helper = i;
            } else {
                qWarning("Inconsistent polygon. (#4)");
            }
            Q_FALLTHROUGH();
        case EndVertex:
            if (m_clockwiseOrder) {
                if (m_edges.at(m_edges.at(i).helper).type == MergeVertex)
                    diagonals.add(std::pair<int, int>(i, m_edges.at(i).helper));
                if (m_edges.at(i).node) {
                    m_edgeList.deleteNode(m_edges.at(i).node);
                    Q_ASSERT(m_edgeList.validate());
                } else {
                    qWarning("Inconsistent polygon. (#5)");
                }
            } else {
                if (m_edges.at(m_edges.at(j).helper).type == MergeVertex)
                    diagonals.add(std::pair<int, int>(i, m_edges.at(j).helper));
                if (m_edges.at(j).node) {
                    m_edgeList.deleteNode(m_edges.at(j).node);
                    Q_ASSERT(m_edgeList.validate());
                } else {
                    qWarning("Inconsistent polygon. (#6)");
                }
            }
            break;
        }
    }

    for (int i = 0; i < diagonals.size(); ++i)
        createDiagonal(diagonals.at(i).first, diagonals.at(i).second);
}